

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_flac_seek_to_pcm_frame(ma_flac *pFlac,ma_uint64 frameIndex)

{
  ma_bool32 mVar1;
  ma_uint64 in_RDI;
  ma_bool32 flacResult;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar2;
  
  if (in_RDI == 0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    mVar1 = ma_dr_flac_seek_to_pcm_frame
                      ((ma_dr_flac *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI);
    if (mVar1 == 1) {
      mVar2 = MA_SUCCESS;
    }
    else {
      mVar2 = MA_ERROR;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_flac_seek_to_pcm_frame(ma_flac* pFlac, ma_uint64 frameIndex)
{
    if (pFlac == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_FLAC)
    {
        ma_bool32 flacResult;

        flacResult = ma_dr_flac_seek_to_pcm_frame(pFlac->dr, frameIndex);
        if (flacResult != MA_TRUE) {
            return MA_ERROR;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)frameIndex;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}